

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O3

void gba_write_word(uint32_t addr,uint32_t value,access_type_t access_type)

{
  uint8_t uVar1;
  uint16_t uVar2;
  gba_ppu_t *pgVar3;
  gbamem_t *pgVar4;
  undefined1 uVar5;
  ushort extraout_AX;
  ushort uVar6;
  gbabus_t *pgVar7;
  uint uVar8;
  uint32_t *warr;
  uint *puVar9;
  gba_ppu_t **ppgVar10;
  gbabus_t **ppgVar11;
  int *piVar12;
  long lVar13;
  undefined8 uVar14;
  ushort uVar15;
  uint uVar16;
  ushort uVar17;
  int iVar18;
  uint32_t uVar19;
  char *pcVar20;
  ulong uVar21;
  uint32_t mirrored;
  uint uVar22;
  
  uVar8 = addr >> 0x18;
  if (access_type == ACCESS_NONSEQUENTIAL) {
    piVar12 = nonsequential_word_cycles;
LAB_001146c1:
    cpu->this_step_ticks = cpu->this_step_ticks + piVar12[uVar8];
  }
  else if (access_type == ACCESS_SEQUENTIAL) {
    piVar12 = sequential_word_cycles;
    goto LAB_001146c1;
  }
  pgVar4 = mem;
  ppgVar10 = (gba_ppu_t **)bus;
  if (0xf < uVar8) {
    return;
  }
  uVar22 = addr & 0xfffffffc;
  puVar9 = &switchD_001146f2::switchdataD_00125c70;
  uVar15 = (ushort)value;
  uVar6 = (ushort)(value >> 0x10);
  switch((ulong)uVar8) {
  case 0:
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar20 = "\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m";
LAB_001147cb:
    printf(pcVar20);
    return;
  case 1:
    goto switchD_001146f2_caseD_1;
  case 2:
    *(uint32_t *)(mem->ewram + (addr & 0x3fffc)) = value;
    return;
  case 3:
    *(uint32_t *)(mem->iwram + (addr & 0x7ffc)) = value;
    return;
  case 4:
    break;
  case 5:
    *(uint32_t *)(ppu->pram + (addr & 0x3fc)) = value;
    return;
  case 6:
    *(uint32_t *)(ppu->vram + (uVar22 + 0xfa000000) % 0x18000) = value;
    return;
  case 7:
    ppu->oam[addr & 0x3fc] = (uint8_t)value;
    *(uint32_t *)(ppu->oam + (addr & 0x3fc)) = value;
    return;
  case 8:
    if (uVar22 == 0x80000c8) {
      uVar19 = 0x80000c8;
LAB_00114983:
      gpio_write(uVar19,uVar15);
      return;
    }
    if (uVar22 == 0x80000c4) {
      gpio_write(0x80000c4,uVar15);
      uVar19 = 0x80000c6;
      uVar15 = uVar6;
      goto LAB_00114983;
    }
  case 0xd:
    if ((bus->backup_type != EEPROM) || ((addr < 0xdffff00 && (0x1000000 < mem->rom_size)))) {
      if (gba_log_verbosity < 3) {
        return;
      }
      pcVar20 = "[DEBUG] Ignoring write to cartridge space address 0x%08X\n";
LAB_00114963:
      uVar21 = (ulong)uVar22;
      goto LAB_00114966;
    }
LAB_001168de:
    gba_write_word_cold_4();
LAB_001168e8:
    gba_write_word_cold_24();
LAB_001168ed:
    gba_write_word_cold_7();
    goto LAB_001168f7;
  default:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar20 = "\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m";
      goto LAB_001147cb;
    case SRAM:
      *(uint32_t *)(mem->backup + (addr & 0x7ffc)) = value;
      pgVar4->backup_dirty = true;
      return;
    case FLASH64K:
    case FLASH128K:
      gba_write_word_cold_1();
    default:
      gba_write_word_cold_3();
    case EEPROM:
      gba_write_word_cold_2();
    }
    goto LAB_001168de;
  }
  if (0x40003ff < addr) {
    return;
  }
  uVar21 = 0x800;
  if ((addr & 0x700fffc) != 0x4000800) {
    uVar21 = (ulong)(uVar22 + 0xfc000000);
  }
  uVar1 = io_register_sizes[uVar21];
  if (uVar1 == '\x04') {
    if (((io_register_access[uVar21] & ~R) != W) && (gba_log_verbosity != 0)) {
      printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m");
    }
    pgVar3 = ppu;
    uVar8 = addr & 0xffc;
    if ((uVar8 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
      if ((uVar8 - 0x28 < 0x18) && (uVar8 = uVar8 - 0x28 >> 2, (0x33U >> (uVar8 & 0x1f) & 1) != 0))
      {
        lVar13 = *(long *)(&DAT_001260e0 + (ulong)uVar8 * 8);
        if (ppu->y < 0xa1 || ppu->y == 0xe3) {
          *(uint32_t *)
           ((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00126110 + (ulong)uVar8 * 8)) = value;
        }
        *(uint32_t *)((long)(pgVar3->screen + -1) + 0x3be + lVar13) = value;
        return;
      }
      goto LAB_001168e8;
    }
    if (uVar8 == 0xa4) {
      iVar18 = 1;
LAB_00114cda:
      uVar19 = 0xffffffff;
      goto LAB_00114ce1;
    }
    if (uVar8 == 0xa0) {
      iVar18 = 0;
      goto LAB_00114cda;
    }
    if ((io_register_access[uVar21] & ~R) != W) {
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
      goto LAB_00114963;
    }
    if (io_register_sizes[uVar21] != '\x04') goto LAB_00116922;
    if (0xbb < uVar8) {
      if (uVar8 < 0xd4) {
        if (uVar8 < 200) {
          if (uVar8 == 0xbc) {
            lVar13 = 0x30;
          }
          else {
            if (uVar8 != 0xc0) goto LAB_0011694c;
            lVar13 = 0x34;
          }
        }
        else if (uVar8 == 200) {
          lVar13 = 0x50;
        }
        else {
          if (uVar8 != 0xcc) goto LAB_0011694c;
          lVar13 = 0x54;
        }
      }
      else {
        if (0x14f < uVar8) {
          if (((uVar8 == 0x150) || (uVar8 == 0x154)) || (uVar8 == 0x800)) {
LAB_00114f0d:
            if (gba_log_verbosity == 0) {
              return;
            }
            uVar14 = 0xffffffff;
            goto LAB_00114f27;
          }
          goto LAB_0011694c;
        }
        if (uVar8 == 0xd4) {
          lVar13 = 0x70;
        }
        else {
          if (uVar8 != 0xd8) goto LAB_0011694c;
          lVar13 = 0x74;
        }
      }
LAB_001155e2:
      ppgVar11 = &bus;
LAB_001155e9:
      *(uint32_t *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) = value;
      return;
    }
    if (uVar8 < 0xa0) {
      ppgVar11 = (gbabus_t **)&ppu;
      if (uVar8 < 0x38) {
        lVar13 = 0x3ecac;
        if (uVar8 == 0x28) goto LAB_001155e9;
        if (uVar8 == 0x2c) {
          lVar13 = 0x3ecb4;
          goto LAB_001155e9;
        }
      }
      else {
        if (uVar8 == 0x38) {
          lVar13 = 0x3ecbc;
          goto LAB_001155e9;
        }
        if (uVar8 == 0x3c) {
          lVar13 = 0x3ecc4;
          goto LAB_001155e9;
        }
      }
    }
    else {
      if (0xaf < uVar8) {
        if (uVar8 == 0xb0) {
          lVar13 = 0x10;
        }
        else {
          if (uVar8 != 0xb4) goto LAB_0011694c;
          lVar13 = 0x14;
        }
        goto LAB_001155e2;
      }
      if ((uVar8 == 0xa0) || (uVar8 == 0xa4)) goto LAB_00114f0d;
    }
    goto LAB_0011694c;
  }
  if (uVar1 != '\x02') {
    if (uVar1 != '\x01') {
      return;
    }
    if ((io_register_access[uVar21] & ~R) == W) {
      if ((addr & 0xffc) == 0x300) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
        }
        goto LAB_00114b07;
      }
      goto LAB_001168ed;
    }
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m",
             (ulong)uVar22);
    }
LAB_00114b07:
    pgVar3 = ppu;
    if ((io_register_access[uVar22 + 0xfc000001] & ~R) != W) {
      if (gba_log_verbosity == 0) goto LAB_00115941;
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
LAB_00114ba1:
      printf(pcVar20);
      goto LAB_00115941;
    }
    if (io_register_sizes[uVar22 + 0xfc000001] == '\x04') {
      uVar16 = value & 0xff00;
      uVar8 = addr & 0xffc;
      if ((uVar8 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
        if ((uVar8 - 0x28 < 0x18) && (uVar8 = uVar8 - 0x28 >> 2, (0x33U >> (uVar8 & 0x1f) & 1) != 0)
           ) {
          lVar13 = *(long *)(&DAT_001260e0 + (ulong)uVar8 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00126110 + (ulong)uVar8 * 8)
                     ) = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                                  *(long *)(&DAT_00126110 + (ulong)uVar8 * 8)) & 0xffff00ff | uVar16
            ;
          }
          *(uint *)((long)(pgVar3->screen + -1) + 0x3be + lVar13) =
               *(uint *)((long)(pgVar3->screen + -1) + 0x3be + lVar13) & 0xffff00ff | uVar16;
          goto LAB_00115941;
        }
        goto LAB_00116911;
      }
      if (uVar8 == 0xa4) {
        iVar18 = 1;
LAB_00114e31:
        write_fifo(apu,iVar18,uVar16,0xff00);
        goto LAB_00115941;
      }
      if (uVar8 == 0xa0) {
        iVar18 = 0;
        goto LAB_00114e31;
      }
      if ((io_register_access[uVar21] & ~R) != W) {
        if (gba_log_verbosity != 0) {
          pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
          goto LAB_00114ba1;
        }
        goto LAB_00115941;
      }
      if (io_register_sizes[uVar21] == '\x04') {
        if (uVar8 < 0xbc) {
          if (0x9f < uVar8) {
            if (uVar8 < 0xb0) {
              if ((uVar8 != 0xa0) && (uVar8 != 0xa4)) goto LAB_0011696c;
              goto LAB_001157ff;
            }
            if (uVar8 == 0xb0) {
              lVar13 = 0x10;
            }
            else {
              if (uVar8 != 0xb4) goto LAB_0011696c;
              lVar13 = 0x14;
            }
            goto LAB_00115923;
          }
          ppgVar11 = (gbabus_t **)&ppu;
          if (uVar8 < 0x38) {
            lVar13 = 0x3ecac;
            if (uVar8 != 0x28) {
              if (uVar8 != 0x2c) goto LAB_0011696c;
              lVar13 = 0x3ecb4;
            }
          }
          else if (uVar8 == 0x38) {
            lVar13 = 0x3ecbc;
          }
          else {
            if (uVar8 != 0x3c) goto LAB_0011696c;
            lVar13 = 0x3ecc4;
          }
        }
        else {
          if (uVar8 < 0xd4) {
            if (uVar8 < 200) {
              if (uVar8 == 0xbc) {
                lVar13 = 0x30;
              }
              else {
                if (uVar8 != 0xc0) goto LAB_0011696c;
                lVar13 = 0x34;
              }
            }
            else if (uVar8 == 200) {
              lVar13 = 0x50;
            }
            else {
              if (uVar8 != 0xcc) goto LAB_0011696c;
              lVar13 = 0x54;
            }
          }
          else {
            if (0x14f < uVar8) {
              if (((uVar8 != 0x150) && (uVar8 != 0x154)) && (uVar8 != 0x800)) goto LAB_0011696c;
LAB_001157ff:
              if (gba_log_verbosity != 0) {
                printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                       ,(ulong)uVar22,0xff00);
              }
              goto LAB_00115941;
            }
            if (uVar8 == 0xd4) {
              lVar13 = 0x70;
            }
            else {
              if (uVar8 != 0xd8) goto LAB_0011696c;
              lVar13 = 0x74;
            }
          }
LAB_00115923:
          ppgVar11 = &bus;
        }
        *(uint *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) =
             *(uint *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) & 0xffff00ff
             | uVar16;
        goto LAB_00115941;
      }
      goto LAB_00116931;
    }
    if (io_register_sizes[uVar22 + 0xfc000001] != '\x02') {
      if ((addr & 0xffc | 1) != 0x301) goto LAB_00116916;
      if ((value >> 8 & 1) == 0) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
        }
        cpu->halt = true;
        goto LAB_00115941;
      }
      goto LAB_0011691d;
    }
    uVar8 = addr & 0xffc;
    if (0x82 < uVar8 >> 2) goto switchD_00114b6c_caseD_a;
    uVar15 = uVar15 & 0xff00;
    ppgVar11 = (gbabus_t **)&ppu;
    switch(uVar8 >> 2) {
    case 0:
      lVar13 = 0x3ec34;
      break;
    case 1:
      pgVar7 = (gbabus_t *)&ppu->DISPSTAT;
      uVar17 = 0xff00;
LAB_00115742:
      ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw =
           (uVar15 ^ ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw) & uVar17 ^
           ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw;
      goto LAB_00115941;
    case 2:
      lVar13 = 0x3ec38;
      break;
    case 3:
      lVar13 = 0x3ec40;
      break;
    case 4:
      lVar13 = 0x3ec48;
      break;
    case 5:
      lVar13 = 0x3ec50;
      break;
    case 6:
      lVar13 = 0x3ec58;
      break;
    case 7:
      lVar13 = 0x3ec60;
      break;
    case 8:
      lVar13 = 0x3ec68;
      break;
    case 9:
      lVar13 = 0x3ec70;
      break;
    default:
      goto switchD_00114b6c_caseD_a;
    case 0xc:
      lVar13 = 0x3ec78;
      break;
    case 0xd:
      lVar13 = 0x3ec80;
      break;
    case 0x10:
      lVar13 = 0x3ec88;
      break;
    case 0x11:
      lVar13 = 0x3ec90;
      break;
    case 0x12:
      lVar13 = 0x3ec98;
      break;
    case 0x13:
      lVar13 = 0x3ec9c;
      break;
    case 0x14:
      lVar13 = 0x3eca0;
      break;
    case 0x15:
      lVar13 = 0x3eca8;
      break;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      if (gba_log_verbosity != 0) {
        pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00114ec0:
        printf(pcVar20);
LAB_00114ec7:
        if (gba_log_verbosity != 0) {
          pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
          goto LAB_00114ba1;
        }
      }
      goto LAB_00115941;
    case 0x22:
      lVar13 = 0x96;
      goto LAB_00115794;
    case 0x2e:
      lVar13 = 0x18;
      goto LAB_001156ee;
    case 0x31:
      lVar13 = 0x38;
      goto LAB_001156ee;
    case 0x34:
      lVar13 = 0x58;
      goto LAB_001156ee;
    case 0x37:
      lVar13 = 0x78;
LAB_001156ee:
      *(ushort *)((long)&bus->interrupt_master_enable + lVar13) =
           uVar15 | *(byte *)((long)&bus->interrupt_master_enable + lVar13);
LAB_00115702:
      gba_dma();
      goto LAB_00115941;
    case 0x40:
      lVar13 = 0xa2;
      goto LAB_00115794;
    case 0x41:
      lVar13 = 0xa4;
      goto LAB_00115794;
    case 0x42:
      lVar13 = 0xa6;
      goto LAB_00115794;
    case 0x43:
      lVar13 = 0xa8;
      goto LAB_00115794;
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x54:
    case 0x55:
    case 0x56:
      if (gba_log_verbosity != 0) {
        pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
        goto LAB_00114ec0;
      }
      goto LAB_00115941;
    case 0x4c:
      lVar13 = 8;
      goto LAB_00115794;
    case 0x4d:
      lVar13 = 0x90;
      goto LAB_00115794;
    case 0x50:
      lVar13 = 0x92;
      goto LAB_00115794;
    case 0x80:
      lVar13 = 4;
LAB_00115794:
      ppgVar11 = &bus;
      break;
    case 0x81:
      (bus->WAITCNT).raw = uVar15 | *(byte *)&bus->WAITCNT;
LAB_00115770:
      on_waitcnt_updated();
      goto LAB_00115941;
    case 0x82:
      if (bus == (gbabus_t *)0x0) goto LAB_00114ec7;
      uVar17 = 1;
      pgVar7 = bus;
      if (uVar8 == 0x208) goto LAB_00115742;
      (bus->interrupt_master_enable).raw = uVar15 | *(byte *)&bus->interrupt_master_enable;
      if ((0x24 < uVar8 - 0xb8) || ((0x1001001001U >> ((ulong)(uVar8 - 0xb8) & 0x3f) & 1) == 0)) {
        if (uVar8 != 0x204) goto LAB_00115941;
        goto LAB_00115770;
      }
      goto LAB_00115702;
    }
    *(ushort *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) =
         uVar15 | *(byte *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13);
LAB_00115941:
    pgVar7 = bus;
    pgVar3 = ppu;
    uVar8 = uVar22 | 2;
    if ((io_register_access[uVar22 + 0xfc000002] & ~R) != W) {
      if (gba_log_verbosity == 0) goto LAB_00115f8e;
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
LAB_001159f8:
      printf(pcVar20,(ulong)uVar8);
      goto LAB_00115f8e;
    }
    if (io_register_sizes[uVar22 + 0xfc000002] == '\x04') {
      uVar16 = value & 0xff0000;
      uVar8 = addr & 0xffc;
      if ((uVar8 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
        if ((uVar8 - 0x28 < 0x18) && (uVar8 = uVar8 - 0x28 >> 2, (0x33U >> (uVar8 & 0x1f) & 1) != 0)
           ) {
          lVar13 = *(long *)(&DAT_001260e0 + (ulong)uVar8 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00126110 + (ulong)uVar8 * 8)
                     ) = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                                  *(long *)(&DAT_00126110 + (ulong)uVar8 * 8)) & 0xff00ffff | uVar16
            ;
          }
          *(uint *)((long)(pgVar3->screen + -1) + 0x3be + lVar13) =
               *(uint *)((long)(pgVar3->screen + -1) + 0x3be + lVar13) & 0xff00ffff | uVar16;
          goto LAB_00115f8e;
        }
LAB_001168f7:
        gba_write_word_cold_14();
LAB_001168fc:
        gba_write_word_cold_17();
        goto LAB_00116901;
      }
      if (uVar8 == 0xa4) {
        iVar18 = 1;
LAB_00115bd9:
        write_fifo(apu,iVar18,uVar16,0xff0000);
        goto LAB_00115f8e;
      }
      if (uVar8 == 0xa0) {
        iVar18 = 0;
        goto LAB_00115bd9;
      }
      if ((io_register_access[uVar21] & ~R) != W) {
        if (gba_log_verbosity != 0) {
          pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
          uVar8 = uVar22;
          goto LAB_001159f8;
        }
        goto LAB_00115f8e;
      }
      if (io_register_sizes[uVar21] != '\x04') goto LAB_00116927;
      if (uVar8 < 0xbc) {
        if (0x9f < uVar8) {
          if (uVar8 < 0xb0) {
            if ((uVar8 == 0xa0) || (uVar8 == 0xa4)) goto LAB_001166a2;
            goto LAB_0011695c;
          }
          if (uVar8 == 0xb0) {
            lVar13 = 0x10;
          }
          else {
            if (uVar8 != 0xb4) goto LAB_0011695c;
            lVar13 = 0x14;
          }
          goto LAB_00116876;
        }
        ppgVar11 = (gbabus_t **)&ppu;
        if (uVar8 < 0x38) {
          lVar13 = 0x3ecac;
          if (uVar8 != 0x28) {
            if (uVar8 != 0x2c) goto LAB_0011695c;
            lVar13 = 0x3ecb4;
          }
        }
        else if (uVar8 == 0x38) {
          lVar13 = 0x3ecbc;
        }
        else {
          if (uVar8 != 0x3c) goto LAB_0011695c;
          lVar13 = 0x3ecc4;
        }
LAB_0011687d:
        *(uint *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) =
             *(uint *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) & 0xff00ffff
             | uVar16;
        goto LAB_00115f8e;
      }
      if (uVar8 < 0xd4) {
        if (uVar8 < 200) {
          if (uVar8 == 0xbc) {
            lVar13 = 0x30;
          }
          else {
            if (uVar8 != 0xc0) goto LAB_0011695c;
            lVar13 = 0x34;
          }
        }
        else if (uVar8 == 200) {
          lVar13 = 0x50;
        }
        else {
          if (uVar8 != 0xcc) goto LAB_0011695c;
          lVar13 = 0x54;
        }
LAB_00116876:
        ppgVar11 = &bus;
        goto LAB_0011687d;
      }
      if (uVar8 < 0x150) {
        if (uVar8 == 0xd4) {
          lVar13 = 0x70;
        }
        else {
          if (uVar8 != 0xd8) goto LAB_0011695c;
          lVar13 = 0x74;
        }
        goto LAB_00116876;
      }
      if (((uVar8 == 0x150) || (uVar8 == 0x154)) || (uVar8 == 0x800)) {
LAB_001166a2:
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m",
                 (ulong)uVar22,0xff0000);
        }
        goto LAB_00115f8e;
      }
LAB_0011695c:
      gba_write_word_cold_16();
LAB_00116964:
      gba_write_word_cold_19();
LAB_0011696c:
      gba_write_word_cold_10();
    }
    if (io_register_sizes[uVar22 + 0xfc000002] != '\x02') {
LAB_00116901:
      gba_write_word_cold_23();
LAB_00116908:
      gba_write_word_cold_21();
LAB_00116911:
      gba_write_word_cold_8();
LAB_00116916:
      gba_write_word_cold_12();
LAB_0011691d:
      gba_write_word_cold_13();
LAB_00116922:
      gba_write_word_cold_25();
LAB_00116927:
      gba_write_word_cold_15();
LAB_0011692c:
      gba_write_word_cold_18();
LAB_00116931:
      gba_write_word_cold_9();
LAB_00116936:
      gba_write_word_cold_22();
LAB_0011693d:
      gba_write_word_cold_20();
switchD_001149dc_caseD_a:
      gba_write_word_cold_6();
LAB_0011694c:
      gba_write_word_cold_26();
switchD_00114b6c_caseD_a:
      gba_write_word_cold_11();
      goto LAB_0011695c;
    }
    uVar6 = uVar6 & 0xff;
    uVar22 = addr & 0xffc | 2;
    uVar5 = (undefined1)(value >> 0x10);
    if (0x81 < uVar22) {
      if (uVar22 < 0x102) {
        if (uVar22 < 0xd2) {
          uVar21 = (ulong)(uVar22 - 0x92);
          if (uVar22 - 0x92 < 0x35) {
            if ((0x1111UL >> (uVar21 & 0x3f) & 1) == 0) {
              if (uVar21 == 0x28) {
                uVar2 = (bus->DMA0CNT_H).raw;
                *(undefined1 *)&bus->DMA0CNT_H = uVar5;
                if (-1 < (short)uVar2) {
                  (pgVar7->DMA0INT).previously_enabled = false;
                }
              }
              else {
                if (uVar21 != 0x34) goto LAB_00115e7e;
                uVar2 = (bus->DMA1CNT_H).raw;
                *(undefined1 *)&bus->DMA1CNT_H = uVar5;
                if (-1 < (short)uVar2) {
                  (pgVar7->DMA1INT).previously_enabled = false;
                }
              }
              goto LAB_00116528;
            }
          }
          else {
LAB_00115e7e:
            if (uVar22 != 0x82) goto LAB_00116936;
          }
LAB_00115e8a:
          if (gba_log_verbosity != 0) {
            pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00115ea1:
            printf(pcVar20);
LAB_00115ea8:
            if (gba_log_verbosity != 0) {
              pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
              goto LAB_001159f8;
            }
          }
        }
        else {
          if (uVar22 == 0xd2) {
            uVar2 = (bus->DMA2CNT_H).raw;
            *(undefined1 *)&bus->DMA2CNT_H = uVar5;
            if (-1 < (short)uVar2) {
              (pgVar7->DMA2INT).previously_enabled = false;
            }
          }
          else {
            if (uVar22 != 0xde) goto LAB_00116936;
            uVar2 = (bus->DMA3CNT_H).raw;
            *(undefined1 *)&bus->DMA3CNT_H = uVar5;
            if (-1 < (short)uVar2) {
              (pgVar7->DMA3INT).previously_enabled = false;
            }
          }
LAB_00116528:
          gba_dma();
        }
        goto LAB_00115f8e;
      }
      if (uVar22 < 0x122) {
        if (uVar22 < 0x10a) {
          if (uVar22 == 0x102) {
            uVar15 = bus->TMCNT_H[0].raw;
            bus->TMCNT_H[0].raw = uVar6 | uVar15 & 0xff00;
            iVar18 = 0;
          }
          else {
            if (uVar22 != 0x106) goto LAB_00116936;
            uVar15 = bus->TMCNT_H[1].raw;
            bus->TMCNT_H[1].raw = uVar6 | uVar15 & 0xff00;
            iVar18 = 1;
          }
        }
        else if (uVar22 == 0x10a) {
          uVar15 = bus->TMCNT_H[2].raw;
          bus->TMCNT_H[2].raw = uVar6 | uVar15 & 0xff00;
          iVar18 = 2;
        }
        else {
          if (uVar22 != 0x10e) goto LAB_00116936;
          uVar15 = bus->TMCNT_H[3].raw;
          bus->TMCNT_H[3].raw = uVar6 | uVar15 & 0xff00;
          iVar18 = 3;
        }
        tmcnth_write(iVar18,uVar15);
        goto LAB_00115f8e;
      }
      if (uVar22 < 0x12a) {
        if ((uVar22 == 0x122) || (uVar22 == 0x126)) goto LAB_00115e29;
      }
      else {
        if (uVar22 == 0x12a) {
LAB_00115e29:
          if (gba_log_verbosity != 0) {
            pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
            goto LAB_00115ea1;
          }
          goto LAB_00115f8e;
        }
        if (uVar22 == 0x132) {
          lVar13 = 0x94;
          ppgVar10 = (gba_ppu_t **)&bus;
          goto LAB_00115f88;
        }
        if (uVar22 == 0x202) {
          (bus->IF).raw = (bus->IF).raw & ~uVar6;
          goto LAB_00115f8e;
        }
      }
      goto LAB_00116936;
    }
    ppgVar10 = &ppu;
    if (uVar22 < 0x26) {
      if (uVar22 < 0x12) {
        if (uVar22 < 10) {
          if (uVar22 == 2) {
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
              goto LAB_00115ea8;
            }
          }
          else {
            if (uVar22 != 6) goto LAB_00116936;
            if (ppu == (gba_ppu_t *)0x0) goto LAB_00115ea8;
            *(undefined1 *)&ppu->y = uVar5;
          }
          goto LAB_00115f8e;
        }
        lVar13 = 0x3ec3c;
        if (uVar22 != 10) {
          if (uVar22 != 0xe) goto LAB_00116936;
          lVar13 = 0x3ec44;
        }
      }
      else if (uVar22 < 0x1a) {
        if (uVar22 == 0x12) {
          lVar13 = 0x3ec4c;
        }
        else {
          if (uVar22 != 0x16) goto LAB_00116936;
          lVar13 = 0x3ec54;
        }
      }
      else if (uVar22 == 0x1a) {
        lVar13 = 0x3ec5c;
      }
      else if (uVar22 == 0x1e) {
        lVar13 = 0x3ec64;
      }
      else {
        if (uVar22 != 0x22) goto LAB_00116936;
        lVar13 = 0x3ec6c;
      }
    }
    else if (uVar22 < 0x46) {
      if (uVar22 < 0x36) {
        if (uVar22 == 0x26) {
          lVar13 = 0x3ec74;
        }
        else {
          if (uVar22 != 0x32) goto LAB_00116936;
          lVar13 = 0x3ec7c;
        }
      }
      else if (uVar22 == 0x36) {
        lVar13 = 0x3ec84;
      }
      else {
        if (uVar22 != 0x42) goto LAB_00116936;
        lVar13 = 0x3ec8c;
      }
    }
    else if (uVar22 < 0x52) {
      if (uVar22 == 0x46) {
        lVar13 = 0x3ec94;
      }
      else {
        if (uVar22 != 0x4a) goto LAB_00116936;
        lVar13 = 0x3ec9a;
      }
    }
    else {
      if (uVar22 != 0x52) {
        if ((uVar22 == 0x62) || (uVar22 == 0x72)) goto LAB_00115e8a;
        goto LAB_00116936;
      }
      lVar13 = 0x3eca4;
    }
LAB_00115f88:
    *(undefined1 *)((long)((*ppgVar10)->screen + -1) + 0x3be + lVar13) = uVar5;
LAB_00115f8e:
    pgVar7 = bus;
    pgVar3 = ppu;
    uVar8 = addr | 3;
    uVar21 = (ulong)uVar8;
    if ((io_register_access[uVar8 + 0xfc000000] & ~R) != W) {
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
      goto LAB_00114966;
    }
    if (io_register_sizes[uVar8 + 0xfc000000] == '\x04') {
      value = value & 0xff000000;
      uVar8 = addr & 0xffc;
      if ((uVar8 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
        if ((uVar8 - 0x28 < 0x18) && (uVar8 = uVar8 - 0x28 >> 2, (0x33U >> (uVar8 & 0x1f) & 1) != 0)
           ) {
          lVar13 = *(long *)(&DAT_001260e0 + (ulong)uVar8 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00126110 + (ulong)uVar8 * 8)
                     ) = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                                  *(long *)(&DAT_00126110 + (ulong)uVar8 * 8)) & 0xffffff | value;
          }
          *(uint *)((long)(pgVar3->screen + -1) + 0x3be + lVar13) =
               *(uint *)((long)(pgVar3->screen + -1) + 0x3be + lVar13) & 0xffffff | value;
          return;
        }
        goto LAB_001168fc;
      }
      if (uVar8 == 0xa4) {
        iVar18 = 1;
LAB_0011621a:
        uVar19 = 0xff000000;
LAB_00114ce1:
        write_fifo(apu,iVar18,value,uVar19);
        return;
      }
      if (uVar8 == 0xa0) {
        iVar18 = 0;
        goto LAB_0011621a;
      }
      uVar22 = addr & 0x7fffffc;
      uVar21 = 0x800;
      if ((addr & 0x700fffc) != 0x4000800) {
        uVar21 = (ulong)(uVar22 + 0xfc000000);
      }
      if ((io_register_access[uVar21] & ~R) != W) {
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
        uVar21 = (ulong)uVar22;
        goto LAB_00114966;
      }
      if (io_register_sizes[uVar21] != '\x04') goto LAB_0011692c;
      if (0xbb < uVar8) {
        if (uVar8 < 0xd4) {
          if (uVar8 < 200) {
            if (uVar8 == 0xbc) {
              lVar13 = 0x30;
            }
            else {
              if (uVar8 != 0xc0) goto LAB_00116964;
              lVar13 = 0x34;
            }
          }
          else if (uVar8 == 200) {
            lVar13 = 0x50;
          }
          else {
            if (uVar8 != 0xcc) goto LAB_00116964;
            lVar13 = 0x54;
          }
        }
        else {
          if (0x14f < uVar8) {
            if (((uVar8 == 0x150) || (uVar8 == 0x154)) || (uVar8 == 0x800)) {
LAB_0011671c:
              if (gba_log_verbosity == 0) {
                return;
              }
              uVar14 = 0xff000000;
LAB_00114f27:
              printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                     ,(ulong)uVar22,uVar14);
              return;
            }
            goto LAB_00116964;
          }
          if (uVar8 == 0xd4) {
            lVar13 = 0x70;
          }
          else {
            if (uVar8 != 0xd8) goto LAB_00116964;
            lVar13 = 0x74;
          }
        }
LAB_001168b3:
        ppgVar11 = &bus;
LAB_001168ba:
        *(uint *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) =
             *(uint *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + lVar13) & 0xffffff |
             value;
        return;
      }
      if (uVar8 < 0xa0) {
        ppgVar11 = (gbabus_t **)&ppu;
        if (uVar8 < 0x38) {
          lVar13 = 0x3ecac;
          if (uVar8 == 0x28) goto LAB_001168ba;
          if (uVar8 == 0x2c) {
            lVar13 = 0x3ecb4;
            goto LAB_001168ba;
          }
        }
        else {
          if (uVar8 == 0x38) {
            lVar13 = 0x3ecbc;
            goto LAB_001168ba;
          }
          if (uVar8 == 0x3c) {
            lVar13 = 0x3ecc4;
            goto LAB_001168ba;
          }
        }
      }
      else {
        if (0xaf < uVar8) {
          if (uVar8 == 0xb0) {
            lVar13 = 0x10;
          }
          else {
            if (uVar8 != 0xb4) goto LAB_00116964;
            lVar13 = 0x14;
          }
          goto LAB_001168b3;
        }
        if ((uVar8 == 0xa0) || (uVar8 == 0xa4)) goto LAB_0011671c;
      }
      goto LAB_00116964;
    }
    if (io_register_sizes[uVar8 + 0xfc000000] != '\x02') goto LAB_00116908;
    uVar16 = uVar8 & 0x7fffffe;
    uVar8 = uVar8 & 0xffe;
    uVar15 = (ushort)((value >> 0x18) << 8);
    if (0x81 < uVar8) {
      if (uVar8 < 0x102) {
        if (0xd1 < uVar8) {
          if (uVar8 == 0xd2) {
            (bus->DMA2CNT_H).raw = uVar15 | *(byte *)&bus->DMA2CNT_H;
            if (-1 < (short)uVar15) {
              (pgVar7->DMA2INT).previously_enabled = false;
            }
            goto LAB_00116670;
          }
          if (uVar8 == 0xde) {
            (bus->DMA3CNT_H).raw = uVar15 | *(byte *)&bus->DMA3CNT_H;
            if (-1 < (short)uVar15) {
              (pgVar7->DMA3INT).previously_enabled = false;
            }
            goto LAB_00116670;
          }
          goto LAB_0011693d;
        }
        uVar21 = (ulong)(uVar8 - 0x92);
        if (uVar8 - 0x92 < 0x35) {
          if ((0x1111UL >> (uVar21 & 0x3f) & 1) == 0) {
            if (uVar21 == 0x28) {
              (bus->DMA0CNT_H).raw = uVar15 | *(byte *)&bus->DMA0CNT_H;
              if (-1 < (short)uVar15) {
                (pgVar7->DMA0INT).previously_enabled = false;
              }
              goto LAB_00116670;
            }
            if (uVar21 == 0x34) {
              (bus->DMA1CNT_H).raw = uVar15 | *(byte *)&bus->DMA1CNT_H;
              if (-1 < (short)uVar15) {
                (pgVar7->DMA1INT).previously_enabled = false;
              }
              goto LAB_00116670;
            }
            goto LAB_00116534;
          }
        }
        else {
LAB_00116534:
          if (uVar8 != 0x82) goto LAB_0011693d;
        }
        goto LAB_00116540;
      }
      if (uVar8 < 0x122) {
        if (0x109 < uVar8) {
          if (uVar8 == 0x10a) {
            uVar17 = bus->TMCNT_H[2].raw;
            bus->TMCNT_H[2].raw = uVar15 | uVar17 & 0xff;
            goto LAB_001165cd;
          }
          if (uVar8 != 0x10e) goto LAB_0011693d;
          uVar17 = bus->TMCNT_H[3].raw;
          bus->TMCNT_H[3].raw = uVar15 | uVar17 & 0xff;
          goto LAB_00116448;
        }
        if (uVar8 == 0x102) {
          uVar17 = bus->TMCNT_H[0].raw;
          bus->TMCNT_H[0].raw = uVar15 | uVar17 & 0xff;
          goto LAB_001165a4;
        }
        if (uVar8 != 0x106) goto LAB_0011693d;
        uVar17 = bus->TMCNT_H[1].raw;
        bus->TMCNT_H[1].raw = uVar15 | uVar17 & 0xff;
        goto LAB_00116346;
      }
      if (uVar8 < 0x12a) {
        if ((uVar8 != 0x122) && (uVar8 != 0x126)) goto LAB_0011693d;
      }
      else if (uVar8 != 0x12a) {
        if (uVar8 == 0x132) {
          lVar13 = 0x94;
          ppgVar10 = (gba_ppu_t **)&bus;
          goto LAB_00116614;
        }
        if (uVar8 == 0x202) {
          (bus->IF).raw = (bus->IF).raw & ~uVar15;
          return;
        }
        goto LAB_0011693d;
      }
      goto LAB_0011649e;
    }
    ppgVar10 = &ppu;
    if (0x25 < uVar8) {
      if (uVar8 < 0x46) {
        if (uVar8 < 0x36) {
          if (uVar8 == 0x26) {
            lVar13 = 0x3ec74;
            goto LAB_00116614;
          }
          if (uVar8 == 0x32) {
            lVar13 = 0x3ec7c;
            goto LAB_00116614;
          }
        }
        else {
          if (uVar8 == 0x36) {
            lVar13 = 0x3ec84;
            goto LAB_00116614;
          }
          if (uVar8 == 0x42) {
            lVar13 = 0x3ec8c;
            goto LAB_00116614;
          }
        }
      }
      else if (uVar8 < 0x52) {
        if (uVar8 == 0x46) {
          lVar13 = 0x3ec94;
          goto LAB_00116614;
        }
        if (uVar8 == 0x4a) {
          lVar13 = 0x3ec9a;
          goto LAB_00116614;
        }
      }
      else {
        if (uVar8 == 0x52) {
          lVar13 = 0x3eca4;
          goto LAB_00116614;
        }
        if ((uVar8 == 0x62) || (uVar8 == 0x72)) goto LAB_00116540;
      }
      goto LAB_0011693d;
    }
    if (0x11 < uVar8) {
      if (uVar8 < 0x1a) {
        if (uVar8 == 0x12) {
          lVar13 = 0x3ec4c;
          goto LAB_00116614;
        }
        if (uVar8 == 0x16) {
          lVar13 = 0x3ec54;
          goto LAB_00116614;
        }
      }
      else {
        if (uVar8 == 0x1a) {
          lVar13 = 0x3ec5c;
          goto LAB_00116614;
        }
        if (uVar8 == 0x1e) {
          lVar13 = 0x3ec64;
          goto LAB_00116614;
        }
        if (uVar8 == 0x22) {
          lVar13 = 0x3ec6c;
          goto LAB_00116614;
        }
      }
      goto LAB_0011693d;
    }
    if (9 < uVar8) {
      lVar13 = 0x3ec3c;
      if (uVar8 == 10) {
LAB_00116614:
        *(ushort *)((long)((*ppgVar10)->screen + -1) + 0x3be + lVar13) =
             uVar15 | *(byte *)((long)((*ppgVar10)->screen + -1) + 0x3be + lVar13);
        return;
      }
      if (uVar8 == 0xe) {
        lVar13 = 0x3ec44;
        goto LAB_00116614;
      }
      goto LAB_0011693d;
    }
    if (uVar8 == 2) goto LAB_00116350;
    if (uVar8 != 6) goto LAB_0011693d;
    if (ppu != (gba_ppu_t *)0x0) {
      ppu->y = uVar15 | (byte)ppu->y;
      return;
    }
    goto LAB_0011655e;
  }
  if ((io_register_access[uVar21] & ~R) != W) {
    ppgVar10 = (gba_ppu_t **)puVar9;
    if (gba_log_verbosity == 0) goto LAB_00115125;
    pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m";
LAB_00114ad4:
    printf(pcVar20,(ulong)uVar22);
    ppgVar10 = (gba_ppu_t **)puVar9;
    goto LAB_00115125;
  }
  uVar16 = addr & 0xffc;
  uVar8 = uVar16 >> 2;
  if (0x82 < uVar8) goto switchD_001149dc_caseD_a;
  puVar9 = (uint *)((long)&switchD_001149dc::switchdataD_00125cc4 +
                   (long)(int)(&switchD_001149dc::switchdataD_00125cc4)[uVar8]);
  ppgVar11 = (gbabus_t **)&ppu;
  switch(uVar8) {
  case 0:
    ppgVar10 = (gba_ppu_t **)0x3ec34;
    break;
  case 1:
    pgVar7 = (gbabus_t *)&ppu->DISPSTAT;
    ppgVar10 = (gba_ppu_t **)0xfff8;
LAB_001150d2:
    ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw =
         (uVar15 ^ ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw) & (ushort)ppgVar10 ^
         ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw;
    ppgVar10 = (gba_ppu_t **)(ulong)(uint)(int)(short)(ushort)ppgVar10;
    goto LAB_00115125;
  case 2:
    ppgVar10 = (gba_ppu_t **)0x3ec38;
    break;
  case 3:
    ppgVar10 = (gba_ppu_t **)0x3ec40;
    break;
  case 4:
    ppgVar10 = (gba_ppu_t **)0x3ec48;
    break;
  case 5:
    ppgVar10 = (gba_ppu_t **)0x3ec50;
    break;
  case 6:
    ppgVar10 = (gba_ppu_t **)0x3ec58;
    break;
  case 7:
    ppgVar10 = (gba_ppu_t **)0x3ec60;
    break;
  case 8:
    ppgVar10 = (gba_ppu_t **)0x3ec68;
    break;
  case 9:
    ppgVar10 = (gba_ppu_t **)0x3ec70;
    break;
  default:
    goto switchD_001149dc_caseD_a;
  case 0xc:
    ppgVar10 = (gba_ppu_t **)0x3ec78;
    break;
  case 0xd:
    ppgVar10 = (gba_ppu_t **)0x3ec80;
    break;
  case 0x10:
    ppgVar10 = (gba_ppu_t **)0x3ec88;
    break;
  case 0x11:
    ppgVar10 = (gba_ppu_t **)0x3ec90;
    break;
  case 0x12:
    ppgVar10 = (gba_ppu_t **)0x3ec98;
    break;
  case 0x13:
    ppgVar10 = (gba_ppu_t **)0x3ec9c;
    break;
  case 0x14:
    ppgVar10 = (gba_ppu_t **)0x3eca0;
    break;
  case 0x15:
    ppgVar10 = (gba_ppu_t **)0x3eca8;
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    ppgVar10 = (gba_ppu_t **)puVar9;
    if (gba_log_verbosity != 0) {
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00114dbb:
      printf(pcVar20,(ulong)uVar16);
LAB_00114dc5:
      ppgVar10 = (gba_ppu_t **)puVar9;
      if (gba_log_verbosity != 0) {
        pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
        goto LAB_00114ad4;
      }
    }
    goto LAB_00115125;
  case 0x22:
    ppgVar10 = (gba_ppu_t **)0x96;
    goto LAB_00115117;
  case 0x2e:
    lVar13 = 0x18;
    goto LAB_00115086;
  case 0x31:
    lVar13 = 0x38;
    goto LAB_00115086;
  case 0x34:
    lVar13 = 0x58;
    goto LAB_00115086;
  case 0x37:
    lVar13 = 0x78;
LAB_00115086:
    *(ushort *)((long)&bus->interrupt_master_enable + lVar13) = uVar15;
LAB_00115094:
    gba_dma();
    goto LAB_00115125;
  case 0x40:
    ppgVar10 = (gba_ppu_t **)0xa2;
    goto LAB_00115117;
  case 0x41:
    ppgVar10 = (gba_ppu_t **)0xa4;
    goto LAB_00115117;
  case 0x42:
    ppgVar10 = (gba_ppu_t **)0xa6;
    goto LAB_00115117;
  case 0x43:
    ppgVar10 = (gba_ppu_t **)0xa8;
    goto LAB_00115117;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x54:
  case 0x55:
  case 0x56:
    ppgVar10 = (gba_ppu_t **)puVar9;
    if (gba_log_verbosity != 0) {
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
      goto LAB_00114dbb;
    }
    goto LAB_00115125;
  case 0x4c:
    ppgVar10 = (gba_ppu_t **)0x8;
    goto LAB_00115117;
  case 0x4d:
    ppgVar10 = (gba_ppu_t **)0x90;
    goto LAB_00115117;
  case 0x50:
    ppgVar10 = (gba_ppu_t **)0x92;
    goto LAB_00115117;
  case 0x80:
    ppgVar10 = (gba_ppu_t **)0x4;
LAB_00115117:
    ppgVar11 = &bus;
    break;
  case 0x81:
    (bus->WAITCNT).raw = uVar15;
LAB_001150f6:
    on_waitcnt_updated();
    ppgVar10 = (gba_ppu_t **)puVar9;
    goto LAB_00115125;
  case 0x82:
    if (bus == (gbabus_t *)0x0) goto LAB_00114dc5;
    ppgVar10 = (gba_ppu_t **)CONCAT62((int6)((ulong)puVar9 >> 0x10),1);
    pgVar7 = bus;
    if (uVar16 == 0x208) goto LAB_001150d2;
    (bus->interrupt_master_enable).raw = uVar15;
    if ((0x24 < uVar16 - 0xb8) ||
       (ppgVar10 = (gba_ppu_t **)0x1001001001,
       (0x1001001001U >> ((ulong)(uVar16 - 0xb8) & 0x3f) & 1) == 0)) {
      puVar9 = (uint *)ppgVar10;
      if (uVar16 != 0x204) goto LAB_00115125;
      goto LAB_001150f6;
    }
    goto LAB_00115094;
  }
  *(ushort *)((long)&((gbabus_t *)ppgVar10)->interrupt_master_enable + (long)*ppgVar11) = uVar15;
LAB_00115125:
  pgVar7 = bus;
  uVar16 = uVar22 | 2;
  if ((io_register_access[uVar22 + 0xfc000002] & ~R) != W) {
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m";
LAB_00116575:
    uVar21 = (ulong)uVar16;
LAB_00114966:
    printf(pcVar20,uVar21);
    return;
  }
  uVar8 = addr & 0xffc | 2;
  if (uVar8 < 0x82) {
    ppgVar10 = &ppu;
    if (uVar8 < 0x26) {
      if (uVar8 < 0x12) {
        if (uVar8 < 10) {
          if (uVar8 == 2) {
LAB_00116350:
            if (gba_log_verbosity == 0) {
              return;
            }
            printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
          }
          else {
            if (uVar8 != 6) goto LAB_0011543d;
            if (ppu != (gba_ppu_t *)0x0) {
              ppu->y = uVar6;
              return;
            }
          }
          goto LAB_0011655e;
        }
        lVar13 = 0x3ec3c;
        if (uVar8 != 10) {
          if (uVar8 != 0xe) goto LAB_0011543d;
          lVar13 = 0x3ec44;
        }
      }
      else if (uVar8 < 0x1a) {
        if (uVar8 == 0x12) {
          lVar13 = 0x3ec4c;
        }
        else {
          if (uVar8 != 0x16) goto LAB_0011543d;
          lVar13 = 0x3ec54;
        }
      }
      else if (uVar8 == 0x1a) {
        lVar13 = 0x3ec5c;
      }
      else if (uVar8 == 0x1e) {
        lVar13 = 0x3ec64;
      }
      else {
        if (uVar8 != 0x22) goto LAB_0011543d;
        lVar13 = 0x3ec6c;
      }
    }
    else if (uVar8 < 0x46) {
      if (uVar8 < 0x36) {
        if (uVar8 == 0x26) goto LAB_00115444;
        if (uVar8 != 0x32) goto LAB_0011543d;
        lVar13 = 0x3ec7c;
      }
      else if (uVar8 == 0x36) {
        lVar13 = 0x3ec84;
      }
      else {
        if (uVar8 != 0x42) goto LAB_0011543d;
        lVar13 = 0x3ec8c;
      }
    }
    else if (uVar8 < 0x52) {
      if (uVar8 == 0x46) {
        lVar13 = 0x3ec94;
      }
      else {
        if (uVar8 != 0x4a) goto LAB_0011543d;
        lVar13 = 0x3ec9a;
      }
    }
    else {
      if (uVar8 != 0x52) {
        if ((uVar8 == 0x62) || (uVar8 == 0x72)) goto LAB_00116540;
        goto LAB_0011543d;
      }
      lVar13 = 0x3eca4;
    }
  }
  else {
    if (uVar8 < 0x102) {
      if (0xd1 < uVar8) {
        if (uVar8 == 0xd2) {
          (bus->DMA2CNT_H).raw = uVar6;
          if (-1 < (int)value) {
            (pgVar7->DMA2INT).previously_enabled = false;
          }
LAB_00116670:
          gba_dma();
          return;
        }
        if (uVar8 == 0xde) {
          (bus->DMA3CNT_H).raw = uVar6;
          if (-1 < (int)value) {
            (pgVar7->DMA3INT).previously_enabled = false;
          }
          goto LAB_00116670;
        }
        goto LAB_0011543d;
      }
      ppgVar10 = (gba_ppu_t **)(ulong)(uVar8 - 0x92);
      if (uVar8 - 0x92 < 0x35) {
        if ((0x1111UL >> ((ulong)ppgVar10 & 0x3f) & 1) == 0) {
          if ((gbabus_t *)ppgVar10 == (gbabus_t *)0x28) {
            (bus->DMA0CNT_H).raw = uVar6;
            if (-1 < (int)value) {
              (pgVar7->DMA0INT).previously_enabled = false;
            }
            goto LAB_00116670;
          }
          if ((gbabus_t *)ppgVar10 == (gbabus_t *)0x34) {
            (bus->DMA1CNT_H).raw = uVar6;
            if (-1 < (int)value) {
              (pgVar7->DMA1INT).previously_enabled = false;
            }
            goto LAB_00116670;
          }
          goto LAB_00115431;
        }
      }
      else {
LAB_00115431:
        if (uVar8 != 0x82) goto LAB_0011543d;
      }
LAB_00116540:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00116557:
      printf(pcVar20);
LAB_0011655e:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar20 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
      goto LAB_00116575;
    }
    if (uVar8 < 0x122) {
      if (uVar8 < 0x10a) {
        if (uVar8 == 0x102) {
          uVar17 = bus->TMCNT_H[0].raw;
          bus->TMCNT_H[0].raw = uVar6;
LAB_001165a4:
          iVar18 = 0;
LAB_001165d2:
          tmcnth_write(iVar18,uVar17);
          return;
        }
        if (uVar8 == 0x106) {
          uVar17 = bus->TMCNT_H[1].raw;
          bus->TMCNT_H[1].raw = uVar6;
LAB_00116346:
          iVar18 = 1;
          goto LAB_001165d2;
        }
      }
      else {
        if (uVar8 == 0x10a) {
          uVar17 = bus->TMCNT_H[2].raw;
          bus->TMCNT_H[2].raw = uVar6;
LAB_001165cd:
          iVar18 = 2;
          goto LAB_001165d2;
        }
        if (uVar8 == 0x10e) {
          uVar17 = bus->TMCNT_H[3].raw;
          bus->TMCNT_H[3].raw = uVar6;
LAB_00116448:
          iVar18 = 3;
          goto LAB_001165d2;
        }
      }
    }
    else if (uVar8 < 0x12a) {
      if ((uVar8 == 0x122) || (uVar8 == 0x126)) goto LAB_0011649e;
    }
    else {
      if (uVar8 == 0x12a) {
LAB_0011649e:
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar20 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
        goto LAB_00116557;
      }
      if (uVar8 == 0x132) {
        lVar13 = 0x94;
        ppgVar10 = (gba_ppu_t **)&bus;
        goto LAB_001154bb;
      }
      if (uVar8 == 0x202) {
        (bus->IF).raw = (bus->IF).raw & ~uVar6;
        return;
      }
    }
LAB_0011543d:
    gba_write_word_cold_5();
    uVar6 = extraout_AX;
LAB_00115444:
    lVar13 = 0x3ec74;
  }
LAB_001154bb:
  *(ushort *)((long)*ppgVar10 + lVar13) = uVar6;
switchD_001146f2_caseD_1:
  return;
}

Assistant:

void gba_write_word(word addr, word value, access_type_t access_type) {
    addr &= ~(sizeof(word) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(word), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            word_to_byte_array(mem->ewram, index, value);
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            word_to_byte_array(mem->iwram, index, value);
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                byte size = get_ioreg_size_for_addr(addr);
                switch (size) {
                    case 0:
                        return;
                    case sizeof(byte):
                        write_byte_ioreg(addr, value & 0xFF);
                        write_byte_ioreg(addr + 1, (value >> 8) & 0xFF);
                        write_byte_ioreg(addr + 2, (value >> 16) & 0xFF);
                        write_byte_ioreg(addr + 3, (value >> 24) & 0xFF);
                        break;
                    case sizeof(half):
                        write_half_ioreg(addr, value & 0xFFFF);
                        write_half_ioreg(addr + 2, (value >> 16) & 0xFFFF);
                        break;
                    case sizeof(word):
                        write_word_ioreg(addr, value);
                }
            }

#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr >= 0x4FFF600 && addr < 0x4FFF700) {
                    mgba_debug_write_byte(addr, value & 0xFF);
                    mgba_debug_write_byte(addr + 1, (value >> 8) & 0xFF);
                    mgba_debug_write_byte(addr + 2, (value >> 16) & 0xFF);
                    mgba_debug_write_byte(addr + 3, (value >> 24) & 0xFF);
                } else {
                    logfatal("Writing 0x%08X to 0x%08X\n", value, addr);
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word_to_byte_array(ppu->pram, index, value);
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            word_to_byte_array(ppu->vram, index, value);
            break;
        }
        case REGION_OAM: {
            word index = addr - 0x07000000;
            index %= OAM_SIZE;
            ppu->oam[index] = value;
            word_to_byte_array(ppu->oam, index, value);
            break;
        }
        case REGION_GAMEPAK0_L:
            switch (addr) {
                case 0x080000C4:
                    gpio_write(0x080000C4, value & 0xFFFF);
                    gpio_write(0x080000C6, (value >> 16) & 0xFFFF);
                    return;
                case 0x080000C8:
                    gpio_write(0x080000C8, value & 0xFFFF);
                    return;
                default:
                    break;
            }
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write word 0x%08X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    word_to_byte_array(mem->backup, addr & 0x7FFF, value);
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logfatal("Backup type EEPROM unimplemented!")
                case FLASH64K:
                case FLASH128K:
                    logfatal("Writing word to flash unimplemented")
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
        default:
            return;
    }
}